

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::MetaVariable::set_value<tinyusdz::value::quatf>(MetaVariable *this,quatf *v)

{
  storage_union local_38;
  vtable_type *local_28 [2];
  
  local_28[0] = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::quatf>()::table;
  local_38.dynamic = (void *)*(undefined8 *)(v->imag)._M_elems;
  local_38._8_8_ = *(undefined8 *)((v->imag)._M_elems + 2);
  linb::any::swap((any *)&local_38,(any *)this);
  if (local_28[0] != (vtable_type *)0x0) {
    (*local_28[0]->destroy)(&local_38);
  }
  local_38._8_8_ = 0;
  local_28[0] = (vtable_type *)((ulong)local_28[0] & 0xffffffffffffff00);
  local_38.dynamic = local_28;
  ::std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_38);
  if ((vtable_type **)local_38.dynamic != local_28) {
    operator_delete(local_38.dynamic,(ulong)((long)&local_28[0]->type_id + 1));
  }
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }